

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O2

Gia_Man_t * Jf_ManDeriveCnfMiter(Gia_Man_t *p,int fVerbose)

{
  Gia_Man_t *pGVar1;
  Jf_Par_t local_120;
  
  memset(&local_120.nProcNum,0,0x100);
  local_120.nLutSize = 6;
  local_120.nCutNum = 8;
  local_120.nRounds = 1;
  local_120.nVerbLimit = 5;
  local_120.DelayTarget = -1;
  local_120.fAreaOnly = 1;
  local_120.fFuncDsd = 0;
  local_120.fGenCnf = 1;
  local_120.fCoarsen = 0;
  local_120.fCutMin = 0;
  local_120.nLutSizeMax = 8;
  local_120.nCutNumMax = 0x10;
  local_120.fOptEdge = local_120.nRounds;
  local_120.fAddOrCla = local_120.nRounds;
  local_120.fVerbose = fVerbose;
  pGVar1 = Jf_ManPerformMapping(p,&local_120);
  return pGVar1;
}

Assistant:

Gia_Man_t * Jf_ManDeriveCnfMiter( Gia_Man_t * p, int fVerbose )
{
    Jf_Par_t Pars, * pPars = &Pars;
    Jf_ManSetDefaultPars( pPars );
    pPars->fGenCnf = 1;
    pPars->fCnfObjIds = 0;
    pPars->fAddOrCla = 1;
    pPars->fVerbose = fVerbose;
    return Jf_ManPerformMapping( p, pPars );
}